

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeVertexReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  Vector<float,_4> *a;
  ulong uVar6;
  float fVar7;
  int iVar8;
  int x;
  float fVar9;
  int iVar10;
  ulong uVar11;
  int iy;
  int iVar12;
  long lVar13;
  Vector<float,_4> *a_00;
  Vector<float,_4> *b;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint in_XMM2_Dc;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Vec4 color;
  Vec4 color_1;
  Vec4 c11;
  Vec4 c10;
  Vec4 c01;
  ShaderEvalContext evalCtx;
  float local_3ec;
  RGBA local_3ac;
  ulong local_3a8;
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_3a0;
  Vector<float,_4> local_388;
  undefined1 local_378 [16];
  float local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 local_358 [16];
  ulong local_348;
  ulong local_340;
  ulong local_338;
  Vector<float,_4> local_330;
  Vector<float,_4> local_320;
  Vector<float,_4> local_310;
  Vector<float,_4> local_300;
  Vector<float,_4> local_2f0;
  Vec4 local_2e0;
  Vector<float,_4> local_2d0;
  Vector<float,_4> local_2c0;
  Vector<float,_4> local_2b0;
  ShaderEvalContext local_2a0;
  
  local_378._0_4_ = result->m_width;
  iVar3 = result->m_height;
  uVar4 = quadGrid->m_gridSize;
  fVar9 = (float)(uVar4 + 1);
  ShaderEvalContext::ShaderEvalContext(&local_2a0,quadGrid);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_3a0,
             (long)((int)fVar9 * (int)fVar9),(allocator_type *)&local_388);
  fVar14 = (float)(int)uVar4;
  lVar13 = 0;
  local_368 = 0.0;
  if (0 < (int)fVar9) {
    local_368 = fVar9;
  }
  fVar7 = 0.0;
  local_3a8 = (ulong)uVar4;
  while (fVar7 != local_368) {
    local_358._0_4_ = fVar7;
    for (uVar11 = 0; (uint)fVar9 != uVar11; uVar11 = uVar11 + 1) {
      ShaderEvalContext::reset(&local_2a0,(float)(int)uVar11 / fVar14,(float)(int)fVar7 / fVar14);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&local_2a0);
      tcu::Vector<float,_4>::Vector(&local_388,&local_2a0.color);
      pVVar1 = local_3a0._M_impl.super__Vector_impl_data._M_start + ((int)lVar13 + (int)uVar11);
      pVVar1->m_data[0] = local_388.m_data[0];
      pVVar1->m_data[1] = local_388.m_data[1];
      pVVar1->m_data[2] = local_388.m_data[2];
      pVVar1->m_data[3] = local_388.m_data[3];
    }
    lVar13 = lVar13 + (ulong)(uint)fVar9;
    fVar7 = (float)(local_358._0_4_ + 1);
  }
  fVar7 = (float)(int)local_378._0_4_;
  iVar12 = 0;
  iVar8 = 0;
  if (0 < (int)local_3a8) {
    iVar8 = (int)local_3a8;
  }
  while (iVar12 != iVar8) {
    iVar2 = iVar12 + 1;
    fVar23 = ((float)iVar12 / fVar14) * (float)iVar3;
    fVar21 = ((float)iVar2 / fVar14) * (float)iVar3;
    fVar15 = ceilf(fVar23 + -0.5);
    fVar16 = ceilf(fVar21 + -0.5);
    local_348 = (ulong)(uint)(iVar12 * (int)fVar9);
    local_340 = (ulong)(uint)(iVar2 * (int)fVar9);
    uVar11 = 0;
    while (uVar6 = local_348, iVar12 = iVar2, uVar11 != local_3a8) {
      iVar10 = (int)uVar11;
      local_338 = uVar11 + 1;
      fVar24 = ((float)iVar10 / fVar14) * fVar7;
      fVar22 = ((float)(int)local_338 / fVar14) * fVar7;
      fVar17 = ceilf(fVar24 + -0.5);
      fVar18 = ceilf(fVar22 + -0.5);
      iVar12 = (int)local_340;
      tcu::Vector<float,_4>::Vector
                (&local_388,
                 local_3a0._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar10));
      tcu::Vector<float,_4>::Vector
                (&local_2b0,
                 local_3a0._M_impl.super__Vector_impl_data._M_start + ((int)uVar6 + iVar10 + 1));
      tcu::Vector<float,_4>::Vector
                (&local_2c0,local_3a0._M_impl.super__Vector_impl_data._M_start + (iVar12 + iVar10));
      tcu::Vector<float,_4>::Vector
                (&local_2d0,
                 local_3a0._M_impl.super__Vector_impl_data._M_start + (iVar12 + iVar10 + 1));
      for (iVar12 = (int)fVar15; uVar11 = local_338, iVar12 < (int)fVar16; iVar12 = iVar12 + 1) {
        fVar25 = (((float)iVar12 + 0.5) - fVar23) * (1.0 / (fVar21 - fVar23));
        auVar19 = ZEXT812(0x3f800000);
        if (fVar25 <= 1.0) {
          auVar19._4_8_ = 0;
          auVar19._0_4_ = fVar25;
        }
        fVar25 = (float)(-(uint)(0.0 < fVar25) & auVar19._0_4_);
        in_XMM2_Dc = in_XMM2_Dc & auVar19._8_4_;
        local_378._4_4_ = 0;
        local_378._0_4_ = fVar25;
        local_378._8_4_ = in_XMM2_Dc;
        local_378._12_4_ = 0;
        for (iVar10 = (int)fVar17; iVar10 < (int)fVar18; iVar10 = iVar10 + 1) {
          fVar26 = (((float)iVar10 + 0.5) - fVar24) * (1.0 / (fVar22 - fVar24));
          auVar20 = ZEXT812(0x3f800000);
          if (fVar26 <= 1.0) {
            auVar20._4_8_ = 0;
            auVar20._0_4_ = fVar26;
          }
          local_368 = (float)(-(uint)(0.0 < fVar26) & auVar20._0_4_);
          local_358._4_4_ = 0;
          local_358._0_4_ = local_368;
          local_358._8_4_ = in_XMM2_Dc & auVar20._8_4_;
          local_358._12_4_ = 0;
          local_368 = (float)local_378._0_4_ + local_368;
          uStack_364 = local_378._4_4_;
          uStack_360 = local_378._8_4_;
          uStack_35c = local_378._12_4_;
          bVar5 = 1.0 < local_368;
          local_3ec = (float)local_378._0_4_;
          if (bVar5) {
            local_3ec = 1.0 - fVar25;
          }
          b = &local_2d0;
          if (!bVar5) {
            b = &local_388;
          }
          a_00 = &local_2b0;
          a = &local_2c0;
          if (!bVar5) {
            a_00 = &local_2c0;
            a = &local_2b0;
          }
          tcu::operator-((tcu *)&local_310,a,b);
          in_XMM2_Dc = local_358._8_4_;
          tcu::operator*((tcu *)&local_300,
                         (float)(-(uint)(local_368 <= 1.0) & local_358._0_4_ |
                                ~-(uint)(local_368 <= 1.0) & (uint)(1.0 - (float)local_358._0_4_)),
                         &local_310);
          tcu::operator+((tcu *)&local_2f0,b,&local_300);
          tcu::operator-((tcu *)&local_330,a_00,b);
          tcu::operator*((tcu *)&local_320,local_3ec,&local_330);
          tcu::operator+((tcu *)&local_2e0,&local_2f0,&local_320);
          tcu::RGBA::RGBA(&local_3ac,&local_2e0);
          *(deUint32 *)
           ((long)(result->m_pixels).m_ptr + (long)(result->m_width * iVar12 + iVar10) * 4) =
               local_3ac.m_value;
        }
      }
    }
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_3a0);
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeVertexReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int				width		= result.getWidth();
	const int				height		= result.getHeight();
	const int				gridSize	= quadGrid.getGridSize();
	const int				stride		= gridSize + 1;
	const bool				hasAlpha	= true; // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext		evalCtx		(quadGrid);

	// Evaluate color for each vertex.
	std::vector<tcu::Vec4>	colors		((gridSize + 1) * (gridSize + 1));
	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		const float	sx			= (float)x / (float)gridSize;
		const float	sy			= (float)y / (float)gridSize;
		const int	vtxNdx		= ((y * (gridSize+1)) + x);

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		DE_ASSERT(!evalCtx.isDiscarded); // Discard is not available in vertex shader.
		tcu::Vec4 color = evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		colors[vtxNdx] = color;
	}

	// Render quads.
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		const float		x0		= (float)x       / (float)gridSize;
		const float		x1		= (float)(x + 1) / (float)gridSize;
		const float		y0		= (float)y       / (float)gridSize;
		const float		y1		= (float)(y + 1) / (float)gridSize;

		const float		sx0		= x0 * (float)width;
		const float		sx1		= x1 * (float)width;
		const float		sy0		= y0 * (float)height;
		const float		sy1		= y1 * (float)height;
		const float		oosx	= 1.0f / (sx1 - sx0);
		const float		oosy	= 1.0f / (sy1 - sy0);

		const int		ix0		= deCeilFloatToInt32(sx0 - 0.5f);
		const int		ix1		= deCeilFloatToInt32(sx1 - 0.5f);
		const int		iy0		= deCeilFloatToInt32(sy0 - 0.5f);
		const int		iy1		= deCeilFloatToInt32(sy1 - 0.5f);

		const int		v00		= (y * stride) + x;
		const int		v01		= (y * stride) + x + 1;
		const int		v10		= ((y + 1) * stride) + x;
		const int		v11		= ((y + 1) * stride) + x + 1;
		const tcu::Vec4	c00		= colors[v00];
		const tcu::Vec4	c01		= colors[v01];
		const tcu::Vec4	c10		= colors[v10];
		const tcu::Vec4	c11		= colors[v11];

		//printf("(%d,%d) -> (%f..%f, %f..%f) (%d..%d, %d..%d)\n", x, y, sx0, sx1, sy0, sy1, ix0, ix1, iy0, iy1);

		for (int iy = iy0; iy < iy1; iy++)
		for (int ix = ix0; ix < ix1; ix++)
		{
			DE_ASSERT(deInBounds32(ix, 0, width));
			DE_ASSERT(deInBounds32(iy, 0, height));

			const float			sfx		= (float)ix + 0.5f;
			const float			sfy		= (float)iy + 0.5f;
			const float			fx1		= deFloatClamp((sfx - sx0) * oosx, 0.0f, 1.0f);
			const float			fy1		= deFloatClamp((sfy - sy0) * oosy, 0.0f, 1.0f);

			// Triangle quad interpolation.
			const bool			tri		= fx1 + fy1 <= 1.0f;
			const float			tx		= tri ? fx1 : (1.0f-fx1);
			const float			ty		= tri ? fy1 : (1.0f-fy1);
			const tcu::Vec4&	t0		= tri ? c00 : c11;
			const tcu::Vec4&	t1		= tri ? c01 : c10;
			const tcu::Vec4&	t2		= tri ? c10 : c01;
			const tcu::Vec4		color	= t0 + (t1-t0)*tx + (t2-t0)*ty;

			result.setPixel(ix, iy, tcu::RGBA(color));
		}
	}
}